

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

void Fra_ClausEstimateCoverageOne(Fra_Sml_t *pSim,int *pLits,int nLits,int *pVar2Id,uint *pResult)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint *puStack_88;
  uint *pSims [16];
  
  if (0 < nLits) {
    iVar1 = pSim->nWordsTotal;
    uVar4 = 0;
    do {
      pSims[uVar4 - 1] =
           (uint *)((long)&pSim[1].pAig + (long)pVar2Id[pLits[uVar4] >> 1] * (long)iVar1 * 4);
      uVar4 = uVar4 + 1;
    } while ((uint)nLits != uVar4);
  }
  if (0 < pSim->nWordsTotal) {
    lVar2 = 0;
    do {
      pResult[lVar2] = 0xffffffff;
      if (0 < nLits) {
        uVar3 = pResult[lVar2];
        uVar4 = 0;
        do {
          uVar3 = uVar3 & ((pLits[uVar4] & 1U) - 1 ^ pSims[uVar4 - 1][lVar2]);
          pResult[lVar2] = uVar3;
          uVar4 = uVar4 + 1;
        } while ((uint)nLits != uVar4);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pSim->nWordsTotal);
  }
  return;
}

Assistant:

void Fra_ClausEstimateCoverageOne( Fra_Sml_t * pSim, int * pLits, int nLits, int * pVar2Id, unsigned * pResult )
{
    unsigned * pSims[16];
    int iVar, i, w;
    for ( i = 0; i < nLits; i++ )
    {
        iVar = lit_var(pLits[i]);
        pSims[i] = Fra_ObjSim( pSim, pVar2Id[iVar] );
    }
    for ( w = 0; w < pSim->nWordsTotal; w++ )
    {
        pResult[w] = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            pResult[w] &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
    }
}